

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O2

uint8_t get_segment_id(CommonModeInfoParams *mi_params,uint8_t *segment_ids,BLOCK_SIZE bsize,
                      int mi_row,int mi_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  undefined7 in_register_00000011;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  iVar5 = (int)CONCAT71(in_register_00000011,bsize);
  iVar6 = mi_params->mi_cols - mi_row;
  iVar4 = 1;
  if (0 < iVar6) {
    iVar6 = iVar4;
  }
  iVar7 = mi_params->mi_rows - iVar5;
  if (0 < iVar7) {
    iVar7 = iVar4;
  }
  bVar2 = 8;
  bVar3 = 8;
  iVar8 = 0;
  while (iVar8 < iVar7) {
    iVar9 = 0;
    bVar1 = bVar2;
    while (bVar2 = bVar1, iVar8 = iVar4, iVar9 < iVar6) {
      bVar3 = segment_ids[mi_params->mi_cols * iVar5 + mi_row];
      iVar9 = iVar4;
      bVar1 = bVar3;
      if (bVar2 < bVar3) {
        bVar3 = bVar2;
        bVar1 = bVar2;
      }
    }
  }
  return bVar3;
}

Assistant:

static inline uint8_t get_segment_id(
    const CommonModeInfoParams *const mi_params, const uint8_t *segment_ids,
    BLOCK_SIZE bsize, int mi_row, int mi_col) {
  const int mi_offset = mi_row * mi_params->mi_cols + mi_col;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int xmis = AOMMIN(mi_params->mi_cols - mi_col, bw);
  const int ymis = AOMMIN(mi_params->mi_rows - mi_row, bh);
  const int seg_stride = mi_params->mi_cols;
  uint8_t segment_id = MAX_SEGMENTS;

  for (int y = 0; y < ymis; ++y) {
    for (int x = 0; x < xmis; ++x) {
      segment_id =
          AOMMIN(segment_id, segment_ids[mi_offset + y * seg_stride + x]);
    }
  }

  assert(segment_id < MAX_SEGMENTS);
  return segment_id;
}